

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_clt_u_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  bVar2 = *(byte *)pfVar1;
  bVar3 = *(byte *)((long)pfVar1 + 1);
  bVar4 = *(byte *)((long)pfVar1 + 2);
  bVar5 = *(byte *)((long)pfVar1 + 3);
  bVar6 = *(byte *)((long)pfVar1 + 4);
  bVar7 = *(byte *)((long)pfVar1 + 5);
  bVar8 = *(byte *)((long)pfVar1 + 6);
  bVar9 = *(byte *)((long)pfVar1 + 7);
  bVar10 = *(byte *)((long)pfVar1 + 8);
  bVar11 = *(byte *)((long)pfVar1 + 9);
  bVar12 = *(byte *)((long)pfVar1 + 10);
  bVar13 = *(byte *)((long)pfVar1 + 0xb);
  bVar14 = *(byte *)((long)pfVar1 + 0xc);
  bVar15 = *(byte *)((long)pfVar1 + 0xd);
  bVar16 = *(byte *)((long)pfVar1 + 0xe);
  bVar17 = *(byte *)((long)pfVar1 + 0xf);
  pfVar1 = (env->active_fpu).fpr + wt;
  bVar18 = *(byte *)pfVar1;
  bVar19 = *(byte *)((long)pfVar1 + 1);
  bVar20 = *(byte *)((long)pfVar1 + 2);
  bVar21 = *(byte *)((long)pfVar1 + 3);
  bVar22 = *(byte *)((long)pfVar1 + 4);
  bVar23 = *(byte *)((long)pfVar1 + 5);
  bVar24 = *(byte *)((long)pfVar1 + 6);
  bVar25 = *(byte *)((long)pfVar1 + 7);
  bVar26 = *(byte *)((long)pfVar1 + 8);
  bVar27 = *(byte *)((long)pfVar1 + 9);
  bVar28 = *(byte *)((long)pfVar1 + 10);
  bVar29 = *(byte *)((long)pfVar1 + 0xb);
  bVar30 = *(byte *)((long)pfVar1 + 0xc);
  bVar31 = *(byte *)((long)pfVar1 + 0xd);
  bVar32 = *(byte *)((long)pfVar1 + 0xe);
  bVar33 = *(byte *)((long)pfVar1 + 0xf);
  pfVar1 = (env->active_fpu).fpr + wd;
  *(byte *)pfVar1 = -((byte)((bVar18 < bVar2) * bVar2 | (bVar18 >= bVar2) * bVar18) == bVar2) ^ 0xff
  ;
  *(byte *)((long)pfVar1 + 1) =
       -((byte)((bVar19 < bVar3) * bVar3 | (bVar19 >= bVar3) * bVar19) == bVar3) ^ 0xff;
  *(byte *)((long)pfVar1 + 2) =
       -((byte)((bVar20 < bVar4) * bVar4 | (bVar20 >= bVar4) * bVar20) == bVar4) ^ 0xff;
  *(byte *)((long)pfVar1 + 3) =
       -((byte)((bVar21 < bVar5) * bVar5 | (bVar21 >= bVar5) * bVar21) == bVar5) ^ 0xff;
  *(byte *)((long)pfVar1 + 4) =
       -((byte)((bVar22 < bVar6) * bVar6 | (bVar22 >= bVar6) * bVar22) == bVar6) ^ 0xff;
  *(byte *)((long)pfVar1 + 5) =
       -((byte)((bVar23 < bVar7) * bVar7 | (bVar23 >= bVar7) * bVar23) == bVar7) ^ 0xff;
  *(byte *)((long)pfVar1 + 6) =
       -((byte)((bVar24 < bVar8) * bVar8 | (bVar24 >= bVar8) * bVar24) == bVar8) ^ 0xff;
  *(byte *)((long)pfVar1 + 7) =
       -((byte)((bVar25 < bVar9) * bVar9 | (bVar25 >= bVar9) * bVar25) == bVar9) ^ 0xff;
  *(byte *)((long)pfVar1 + 8) =
       -((byte)((bVar26 < bVar10) * bVar10 | (bVar26 >= bVar10) * bVar26) == bVar10) ^ 0xff;
  *(byte *)((long)pfVar1 + 9) =
       -((byte)((bVar27 < bVar11) * bVar11 | (bVar27 >= bVar11) * bVar27) == bVar11) ^ 0xff;
  *(byte *)((long)pfVar1 + 10) =
       -((byte)((bVar28 < bVar12) * bVar12 | (bVar28 >= bVar12) * bVar28) == bVar12) ^ 0xff;
  *(byte *)((long)pfVar1 + 0xb) =
       -((byte)((bVar29 < bVar13) * bVar13 | (bVar29 >= bVar13) * bVar29) == bVar13) ^ 0xff;
  *(byte *)((long)pfVar1 + 0xc) =
       -((byte)((bVar30 < bVar14) * bVar14 | (bVar30 >= bVar14) * bVar30) == bVar14) ^ 0xff;
  *(byte *)((long)pfVar1 + 0xd) =
       -((byte)((bVar31 < bVar15) * bVar15 | (bVar31 >= bVar15) * bVar31) == bVar15) ^ 0xff;
  *(byte *)((long)pfVar1 + 0xe) =
       -((byte)((bVar32 < bVar16) * bVar16 | (bVar32 >= bVar16) * bVar32) == bVar16) ^ 0xff;
  *(byte *)((long)pfVar1 + 0xf) =
       -((byte)((bVar33 < bVar17) * bVar17 | (bVar33 >= bVar17) * bVar33) == bVar17) ^ 0xff;
  return;
}

Assistant:

void helper_msa_clt_u_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_clt_u_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_clt_u_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_clt_u_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_clt_u_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_clt_u_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_clt_u_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_clt_u_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_clt_u_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_clt_u_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_clt_u_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_clt_u_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_clt_u_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_clt_u_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_clt_u_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_clt_u_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_clt_u_df(DF_BYTE, pws->b[15], pwt->b[15]);
}